

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

ssize_t __thiscall
TasGrid::TasmanianSparseGrid::write(TasmanianSparseGrid *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  ofstream ofs;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  long local_228;
  filebuf local_220 [24];
  int aiStack_208 [54];
  ios_base local_130 [264];
  
  ::std::ofstream::ofstream(&local_228);
  ::std::ofstream::open((char *)&local_228,__fd);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
    if ((char)__buf == '\0') {
      writeAscii(this,(ostream *)&local_228);
    }
    else {
      writeBinary(this,(ostream *)&local_228);
    }
    ::std::ofstream::close();
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
    ::std::filebuf::~filebuf(local_220);
    sVar1 = ::std::ios_base::~ios_base(local_130);
    return sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_248[0] = local_238;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"ERROR: occurred when trying to write to file: ","");
  plVar2 = (long *)::std::__cxx11::string::append((char *)local_248);
  local_268 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_268 == plVar3) {
    local_258 = *plVar3;
    lStack_250 = plVar2[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar3;
  }
  local_260 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ::std::runtime_error::runtime_error(this_00,(string *)&local_268);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TasmanianSparseGrid::write(const char *filename, bool binary) const{
    std::ofstream ofs;
    if (binary == mode_binary){
        ofs.open(filename, std::ios::out | std::ios::binary);
    }else{
        ofs.open(filename);
    }
    if (!ofs.good()) throw std::runtime_error(std::string("ERROR: occurred when trying to write to file: ") + filename);
    write(ofs, binary);
    ofs.close();
}